

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_read_filter_row(png_structrp pp,png_row_infop row_info,png_bytep row,
                        png_const_bytep prev_row,int filter)

{
  int filter_local;
  png_const_bytep prev_row_local;
  png_bytep row_local;
  png_row_infop row_info_local;
  png_structrp pp_local;
  
  if ((0 < filter) && (filter < 5)) {
    if (pp->read_filter[0] == (_func_void_png_row_infop_png_bytep_png_const_bytep *)0x0) {
      png_init_filter_functions(pp);
    }
    (*pp->read_filter[filter + -1])(row_info,row,prev_row);
  }
  return;
}

Assistant:

void /* PRIVATE */
png_read_filter_row(png_structrp pp, png_row_infop row_info, png_bytep row,
    png_const_bytep prev_row, int filter)
{
   /* OPTIMIZATION: DO NOT MODIFY THIS FUNCTION, instead #define
    * PNG_FILTER_OPTIMIZATIONS to a function that overrides the generic
    * implementations.  See png_init_filter_functions above.
    */
   if (filter > PNG_FILTER_VALUE_NONE && filter < PNG_FILTER_VALUE_LAST)
   {
      if (pp->read_filter[0] == NULL)
         png_init_filter_functions(pp);

      pp->read_filter[filter-1](row_info, row, prev_row);
   }
}